

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O3

int Gia_MiniAigSuperMerge(Vec_Int_t *p,int nPis)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  
  uVar4 = p->nSize;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    iVar2 = 0;
    uVar6 = 0;
  }
  else {
    piVar1 = p->pArray;
    lVar7 = 0;
    iVar2 = 0;
    uVar6 = 0;
    iVar3 = -1;
    do {
      iVar8 = piVar1[lVar7];
      if (iVar3 == iVar8) {
        if (((int)uVar6 < 0) || ((uint)uVar5 <= uVar6)) goto LAB_0078aad5;
        iVar3 = (iVar3 / nPis + 1) * nPis + iVar3 % nPis;
        iVar2 = 1;
        iVar8 = -1;
LAB_0078aa8b:
        uVar5 = (ulong)uVar6;
        uVar6 = uVar6 + 1;
        piVar1[uVar5] = iVar3;
      }
      else if (iVar3 != -1) {
        if ((-1 < (int)uVar6) && (uVar6 < (uint)uVar5)) goto LAB_0078aa8b;
        goto LAB_0078aad5;
      }
      lVar7 = lVar7 + 1;
      uVar4 = p->nSize;
      uVar5 = (ulong)(int)uVar4;
      iVar3 = iVar8;
    } while (lVar7 < (long)uVar5);
    if (iVar8 != -1) {
      if (((int)uVar6 < 0) || ((int)uVar4 <= (int)uVar6)) {
LAB_0078aad5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      uVar5 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
      p->pArray[uVar5] = iVar8;
      uVar4 = p->nSize;
    }
  }
  if ((int)uVar6 <= (int)uVar4) {
    p->nSize = uVar6;
    return iVar2;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int Gia_MiniAigSuperMerge( Vec_Int_t * p, int nPis )
{
    int i, k = 0, This, Prev = -1, fChange = 0;
    Vec_IntForEachEntry( p, This, i )
    {
        if ( Prev == This )
        {
            Vec_IntWriteEntry( p, k++, (This/nPis+1)*nPis + This%nPis );
            Prev = -1;
            fChange = 1;
        }
        else 
        {
            if ( Prev != -1 ) 
                Vec_IntWriteEntry( p, k++, Prev );
            Prev = This;
        }
    }
    if ( Prev != -1 )
        Vec_IntWriteEntry( p, k++, Prev );
    Vec_IntShrink( p, k );
    return fChange;
}